

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_DropInventory
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *this;
  PClassActor *type;
  AInventory *item;
  bool bVar1;
  bool local_4e;
  bool local_4b;
  AInventory *inv;
  MetaClass *drop;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe43,
                  "int AF_AActor_A_DropInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar1) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe43,
                  "int AF_AActor_A_DropInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = (AActor *)(param->field_0).field_1.a;
  local_4b = true;
  if (this != (AActor *)0x0) {
    local_4b = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
  }
  if (local_4b == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe43,
                  "int AF_AActor_A_DropInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe44,
                  "int AF_AActor_A_DropInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar1 = false;
  if ((param[1].field_0.field_3.Type == '\x03') &&
     (bVar1 = true, param[1].field_0.field_1.atag != 1)) {
    bVar1 = param[1].field_0.field_1.a == (void *)0x0;
  }
  if (bVar1) {
    type = (PClassActor *)param[1].field_0.field_1.a;
    local_4e = true;
    if (type != (PClassActor *)0x0) {
      local_4e = PClass::IsDescendantOf((PClass *)type,AInventory::RegistrationInfo.MyClass);
    }
    if (local_4e != false) {
      if ((type != (PClassActor *)0x0) &&
         (item = AActor::FindInventory(this,type,false), item != (AInventory *)0x0)) {
        AActor::DropInventory(this,item);
      }
      return 0;
    }
    __assert_fail("drop == NULL || drop->IsDescendantOf(RUNTIME_CLASS(AInventory))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe44,
                  "int AF_AActor_A_DropInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xe44,
                "int AF_AActor_A_DropInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_DropInventory)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS(drop, AInventory);

	if (drop)
	{
		AInventory *inv = self->FindInventory(drop);
		if (inv)
		{
			self->DropInventory(inv);
		}
	}
	return 0;
}